

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall
QScrollerPrivate::updateVelocity(QScrollerPrivate *this,QPointF *deltaPixelRaw,qint64 deltaTime)

{
  QPointF *lhs;
  qreal *this_00;
  QPointF QVar1;
  QScrollerPropertiesPrivate *pQVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  QPointF QVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  QPointF QVar20;
  QPointF local_d8;
  QPointF local_c8;
  undefined1 local_b8 [16];
  QDebug local_a0;
  QPointF local_98;
  QPointF local_88;
  undefined1 local_78 [16];
  QPointF local_68;
  undefined4 uStack_58;
  undefined4 local_54;
  char *local_50;
  QPointF local_40;
  
  local_40.yp = *(qreal *)(in_FS_OFFSET + 0x28);
  if (deltaTime < 1) goto LAB_005dd45a;
  QVar20 = QScroller::pixelPerMeter(this->q_ptr);
  pQVar2 = (this->properties).d.d;
  QVar16 = *deltaPixelRaw;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68.xp._0_4_ = 2;
    local_68.xp._4_4_ = 0;
    local_68.yp._0_4_ = 0;
    local_68.yp._4_4_ = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_50 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)local_b8,"QScroller::updateVelocity(");
    local_40.xp = (qreal)pQVar5->stream;
    *(int *)((long)local_40.xp + 0x28) = *(int *)((long)local_40.xp + 0x28) + 1;
    ::operator<<((Stream *)local_78,&local_40);
    pQVar5 = QDebug::operator<<((QDebug *)local_78," [delta pix], ");
    pQVar5 = QDebug::operator<<(pQVar5,deltaTime);
    QDebug::operator<<(pQVar5," [delta ms])");
    QDebug::~QDebug((QDebug *)local_78);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug((QDebug *)local_b8);
  }
  dVar18 = (double)deltaTime;
  QVar1 = *deltaPixelRaw;
  uVar9 = (undefined4)((ulong)dVar18 >> 0x20);
  auVar13._8_4_ = SUB84(dVar18,0);
  auVar13._0_8_ = dVar18;
  auVar13._12_4_ = uVar9;
  auVar13 = divpd((undefined1  [16])QVar1,auVar13);
  dVar19 = auVar13._0_8_;
  dVar12 = auVar13._8_8_;
  uVar6 = -(ulong)(dVar19 < -dVar19);
  uVar7 = -(ulong)(dVar12 < -dVar12);
  auVar14._0_8_ =
       (double)(~uVar7 & (ulong)dVar12 | (ulong)-dVar12 & uVar7) +
       (double)(~uVar6 & (ulong)dVar19 | (ulong)-dVar19 & uVar6);
  if (2.5 < (auVar14._0_8_ / ((QVar20.xp + QVar20.yp) * 0.5)) * 1000.0) {
    auVar15._0_8_ = QVar20.xp * QVar1.xp * 2.5;
    auVar15._8_8_ = QVar20.yp * QVar1.yp * 2.5;
    auVar13 = divpd(auVar15,_DAT_0067d410);
    auVar14._8_8_ = auVar14._0_8_;
    QVar16 = (QPointF)divpd(auVar13,auVar14);
  }
  auVar3._8_4_ = SUB84(dVar18,0);
  auVar3._0_8_ = dVar18;
  auVar3._12_4_ = uVar9;
  auVar13 = divpd((undefined1  [16])QVar16,auVar3);
  auVar17._0_8_ = auVar13._0_8_ * -1000.0;
  auVar17._8_8_ = auVar13._8_8_ * -1000.0;
  local_78 = divpd(auVar17,(undefined1  [16])QVar20);
  if (50.0 <= dVar18) {
    dVar18 = 50.0;
  }
  dVar19 = pQVar2->dragVelocitySmoothingFactor;
  lhs = &this->releaseVelocity;
  local_68.xp._0_4_ = 0;
  local_68.xp._4_4_ = 0;
  local_68.yp._0_4_ = 0;
  local_68.yp._4_4_ = 0;
  bVar4 = ::operator!=(lhs,&local_68);
  lcScroller();
  if (((ulong)deltaTime < 100) && (bVar4)) {
    dVar19 = (dVar18 * dVar19) / 50.0;
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_68.xp._0_4_ = 2;
      local_68.xp._4_4_ = 0;
      local_68.yp._0_4_ = 0;
      local_68.yp._4_4_ = 0;
      uStack_58 = 0;
      local_54 = 0;
      local_50 = lcScroller::category.name;
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(&local_a0,"SMOOTHED from ");
      local_98.xp = (qreal)pQVar5->stream;
      *(int *)((long)local_98.xp + 0x28) = *(int *)((long)local_98.xp + 0x28) + 1;
      this_00 = &local_98.yp;
      ::operator<<((QDebug)this_00,&local_98);
      pQVar5 = QDebug::operator<<((QDebug *)this_00," to ");
      local_88.xp = (qreal)pQVar5->stream;
      *(int *)((long)local_88.xp + 0x28) = *(int *)((long)local_88.xp + 0x28) + 1;
      dVar12 = (1.0 - dVar19) * (this->releaseVelocity).yp + dVar19 * (double)local_78._8_8_;
      local_b8._8_4_ = SUB84(dVar12,0);
      local_b8._0_8_ = (1.0 - dVar19) * lhs->xp + dVar19 * (double)local_78._0_8_;
      local_b8._12_4_ = (int)((ulong)dVar12 >> 0x20);
      ::operator<<((QDebug)&local_88.yp,&local_88);
      QDebug::~QDebug((QDebug *)&local_88.yp);
      QDebug::~QDebug((QDebug *)&local_88);
      QDebug::~QDebug((QDebug *)this_00);
      QDebug::~QDebug((QDebug *)&local_98);
      QDebug::~QDebug(&local_a0);
    }
    dVar12 = lhs->xp;
    if (((double)local_78._0_8_ != 0.0) || (NAN((double)local_78._0_8_))) {
      bVar4 = (double)local_78._0_8_ < 0.0;
      if (0.0 <= dVar12) {
        bVar4 = 0.0 < (double)local_78._0_8_ != dVar12 <= 0.0 && 0.0 <= (double)local_78._0_8_;
      }
      if (bVar4) goto LAB_005dd25f;
    }
    else {
LAB_005dd25f:
      local_78._0_8_ = (double)local_78._0_8_ * dVar19 + (1.0 - dVar19) * dVar12;
    }
    dVar12 = (this->releaseVelocity).yp;
    if (((double)local_78._8_8_ != 0.0) || (NAN((double)local_78._8_8_))) {
      bVar4 = (double)local_78._8_8_ < 0.0;
      if (0.0 <= dVar12) {
        bVar4 = 0.0 < (double)local_78._8_8_ != dVar12 <= 0.0 && 0.0 <= (double)local_78._8_8_;
      }
      if (!bVar4) goto LAB_005dd38c;
    }
    local_78._8_8_ = (double)local_78._8_8_ * dVar19 + (1.0 - dVar19) * dVar12;
  }
  else if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68.xp._0_4_ = 2;
    local_68.xp._4_4_ = 0;
    local_68.yp._0_4_ = 0;
    local_68.yp._4_4_ = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_50 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)local_b8,"NO SMOOTHING to ");
    local_c8.xp = (qreal)pQVar5->stream;
    *(int *)((long)local_c8.xp + 0x28) = *(int *)((long)local_c8.xp + 0x28) + 1;
    ::operator<<((QDebug)&local_c8.yp,&local_c8);
    QDebug::~QDebug((QDebug *)&local_c8.yp);
    QDebug::~QDebug((QDebug *)&local_c8);
    QDebug::~QDebug((QDebug *)local_b8);
  }
LAB_005dd38c:
  dVar19 = pQVar2->maximumVelocity;
  uVar8 = SUB84(dVar19,0);
  uVar10 = (undefined4)((ulong)dVar19 >> 0x20);
  dVar12 = -dVar19;
  uVar9 = uVar8;
  if ((double)local_78._0_8_ <= dVar19) {
    uVar9 = local_78._0_4_;
    uVar10 = local_78._4_4_;
  }
  uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
  if ((double)CONCAT44(uVar10,uVar9) <= dVar12) {
    uVar9 = uVar8;
    uVar10 = uVar11;
  }
  (this->releaseVelocity).xp = (qreal)CONCAT44(uVar10,uVar9);
  dVar19 = pQVar2->maximumVelocity;
  uVar9 = SUB84(dVar19,0);
  uVar10 = (undefined4)((ulong)dVar19 >> 0x20);
  if ((double)local_78._8_8_ <= dVar19) {
    uVar9 = local_78._8_4_;
    uVar10 = local_78._12_4_;
  }
  if ((double)CONCAT44(uVar10,uVar9) <= dVar12) {
    uVar9 = uVar8;
    uVar10 = uVar11;
  }
  (this->releaseVelocity).yp = (qreal)CONCAT44(uVar10,uVar9);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68.xp._0_4_ = 2;
    local_68.xp._4_4_ = 0;
    local_68.yp._0_4_ = 0;
    local_68.yp._4_4_ = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_50 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)local_b8,"  --> new velocity:");
    local_d8.xp = (qreal)pQVar5->stream;
    *(int *)((long)local_d8.xp + 0x28) = *(int *)((long)local_d8.xp + 0x28) + 1;
    ::operator<<((QDebug)&local_d8.yp,&local_d8);
    QDebug::~QDebug((QDebug *)&local_d8.yp);
    QDebug::~QDebug((QDebug *)&local_d8);
    QDebug::~QDebug((QDebug *)local_b8);
  }
LAB_005dd45a:
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_40.yp) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::updateVelocity(const QPointF &deltaPixelRaw, qint64 deltaTime)
{
    if (deltaTime <= 0)
        return;

    Q_Q(QScroller);
    QPointF ppm = q->pixelPerMeter();
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF deltaPixel = deltaPixelRaw;

    qCDebug(lcScroller) << "QScroller::updateVelocity(" << deltaPixelRaw
                        << " [delta pix], " << deltaTime << " [delta ms])";

    // faster than 2.5mm/ms seems bogus (that would be a screen height in ~20 ms)
    if (((deltaPixelRaw / qreal(deltaTime)).manhattanLength() / ((ppm.x() + ppm.y()) / 2) * 1000) > qreal(2.5))
        deltaPixel = deltaPixelRaw * qreal(2.5) * ppm / 1000 / (deltaPixelRaw / qreal(deltaTime)).manhattanLength();

    QPointF newv = -deltaPixel / qreal(deltaTime) * qreal(1000) / ppm;
    // around 95% of all updates are in the [1..50] ms range, so make sure
    // to scale the smoothing factor over that range: this way a 50ms update
    // will have full impact, while 5ms update will only have a 10% impact.
    qreal smoothing = sp->dragVelocitySmoothingFactor * qMin(qreal(deltaTime), qreal(50)) / qreal(50);

    // only smooth if we already have a release velocity and only if the
    // user hasn't stopped to move his finger for more than 100ms
    if ((releaseVelocity != QPointF(0, 0)) && (deltaTime < 100)) {
        qCDebug(lcScroller) << "SMOOTHED from " << newv << " to "
                            << newv * smoothing + releaseVelocity * (qreal(1) - smoothing);
        // smooth x or y only if the new velocity is either 0 or at least in
        // the same direction of the release velocity
        if (!newv.x() || (qSign(releaseVelocity.x()) == qSign(newv.x())))
            newv.setX(newv.x() * smoothing + releaseVelocity.x() * (qreal(1) - smoothing));
        if (!newv.y() || (qSign(releaseVelocity.y()) == qSign(newv.y())))
            newv.setY(newv.y() * smoothing + releaseVelocity.y() * (qreal(1) - smoothing));
    } else
        qCDebug(lcScroller) << "NO SMOOTHING to " << newv;

    releaseVelocity.setX(qBound(-sp->maximumVelocity, newv.x(), sp->maximumVelocity));
    releaseVelocity.setY(qBound(-sp->maximumVelocity, newv.y(), sp->maximumVelocity));

    qCDebug(lcScroller) << "  --> new velocity:" << releaseVelocity;
}